

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

void proto2_unittest::ComplexOptionType1::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  Nullable<const_char_*> failure_msg;
  ComplexOptionType1 *_this;
  ComplexOptionType1 *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (ComplexOptionType1 *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::ComplexOptionType1_const*,proto2_unittest::ComplexOptionType1*>
                          ((ComplexOptionType1 **)local_18,&local_20,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_custom_options.pb.cc"
               ,0xe34,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_20->field_0)._impl_.foo4_,(RepeatedField<int> *)(from_msg + 3));
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar2 & 7) != 0) {
    if ((uVar2 & 1) != 0) {
      *(undefined4 *)((long)&local_20->field_0 + 0x30) =
           *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
    if ((uVar2 & 2) != 0) {
      (local_20->field_0)._impl_.foo2_ = *(int32_t *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
    if ((uVar2 & 4) != 0) {
      *(int *)((long)&local_20->field_0 + 0x38) = (int)from_msg[4]._internal_metadata_.ptr_;
    }
  }
  pHVar1 = &(local_20->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(local_20->field_0)._impl_._extensions_,
             (MessageLite *)_ComplexOptionType1_default_instance_,(ExtensionSet *)(from_msg + 1));
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_20->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void ComplexOptionType1::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ComplexOptionType1*>(&to_msg);
  auto& from = static_cast<const ComplexOptionType1&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.ComplexOptionType1)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_foo4()->MergeFrom(from._internal_foo4());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.foo_ = from._impl_.foo_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.foo2_ = from._impl_.foo2_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.foo3_ = from._impl_.foo3_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}